

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_nanohttp(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int n_URL_2;
  undefined **ppuVar23;
  int n_filename;
  uint uVar24;
  undefined4 *puVar25;
  undefined *puVar26;
  undefined *puVar27;
  undefined8 uVar28;
  int n_filename_1;
  undefined8 *puVar29;
  int test_ret;
  int test_ret_1;
  uint uVar30;
  undefined8 local_48;
  uint local_40;
  
  if (quiet == '\0') {
    puts("Testing nanohttp : 13 of 17 functions ...");
  }
  iVar3 = xmlMemBlocks();
  lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPAuthHeader(lVar22);
  call_tests = call_tests + 1;
  if (lVar22 != 0) {
    xmlNanoHTTPClose(lVar22);
  }
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPAuthHeader",(ulong)(uint)(iVar5 - iVar3));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlNanoHTTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPCleanup",(ulong)(uint)(iVar7 - iVar5));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPContentLength(lVar22);
  call_tests = call_tests + 1;
  if (lVar22 != 0) {
    xmlNanoHTTPClose(lVar22);
  }
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPContentLength",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPEncoding(lVar22);
  call_tests = call_tests + 1;
  if (lVar22 != 0) {
    xmlNanoHTTPClose(lVar22);
  }
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    iVar11 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPEncoding",(ulong)(uint)(iVar11 - iVar9));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar30 = 0;
  do {
    ppuVar23 = &PTR_anon_var_dwarf_62c_00162d28;
    uVar24 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar30 < 5) {
        puVar27 = (&PTR_anon_var_dwarf_62c_00162d28)[uVar30];
      }
      else {
        puVar27 = (undefined *)0x0;
      }
      if (uVar24 < 5) {
        puVar26 = *ppuVar23;
      }
      else {
        puVar26 = (undefined *)0x0;
      }
      xmlNanoHTTPFetch(puVar27,puVar26,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPFetch",(ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",(ulong)uVar30);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
      ppuVar23 = ppuVar23 + 1;
    } while (uVar24 != 6);
    uVar30 = uVar30 + 1;
  } while (uVar30 != 6);
  function_tests = function_tests + 1;
  iVar12 = xmlMemBlocks();
  xmlNanoHTTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar12 != iVar13) {
    iVar14 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPInit",(ulong)(uint)(iVar14 - iVar12));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPMimeType(lVar22);
  call_tests = call_tests + 1;
  if (lVar22 != 0) {
    xmlNanoHTTPClose(lVar22);
  }
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    iVar16 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPMimeType",(ulong)(uint)(iVar16 - iVar14));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  iVar16 = 0;
  uVar30 = 0;
  do {
    iVar17 = xmlMemBlocks();
    if (uVar30 < 7) {
      uVar28 = *puVar29;
    }
    else {
      uVar28 = 0;
    }
    xmlNanoHTTPOpen(uVar28,0);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoHTTPOpen",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar30 = uVar30 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar30 != 8);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  iVar17 = 0;
  uVar30 = 0;
  do {
    iVar18 = xmlMemBlocks();
    if (uVar30 < 7) {
      uVar28 = *puVar29;
    }
    else {
      uVar28 = 0;
    }
    xmlNanoHTTPOpenRedir(uVar28,0,0);
    xmlNanoHTTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoHTTPOpenRedir",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d");
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar30 = uVar30 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar30 != 8);
  local_40 = (uint)(iVar14 != iVar15);
  function_tests = function_tests + 1;
  iVar14 = 0;
  local_48 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    puVar25 = &DAT_0015fd14;
    iVar15 = 0;
    do {
      iVar18 = xmlMemBlocks();
      lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
      xmlNanoHTTPRead(lVar22,0,*puVar25);
      call_tests = call_tests + 1;
      if (lVar22 != 0) {
        xmlNanoHTTPClose(lVar22);
      }
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPRead",(ulong)(uint)(iVar19 - iVar18));
        iVar14 = iVar14 + 1;
        printf(" %d",0);
        printf(" %d",local_48);
        printf(" %d");
        putchar(10);
      }
      iVar15 = iVar15 + 1;
      puVar25 = puVar25 + 1;
    } while (iVar15 != 4);
    local_48 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  lVar22 = xmlNanoHTTPOpen("http://localhost/",0);
  xmlNanoHTTPReturnCode(lVar22);
  call_tests = call_tests + 1;
  if (lVar22 != 0) {
    xmlNanoHTTPClose(lVar22);
  }
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar15 != iVar18) {
    iVar19 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoHTTPReturnCode",(ulong)(uint)(iVar19 - iVar15));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar30 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    ppuVar23 = &PTR_anon_var_dwarf_62c_00162d28;
    uVar24 = 0;
    do {
      iVar20 = xmlMemBlocks();
      if (uVar24 < 5) {
        puVar27 = *ppuVar23;
      }
      else {
        puVar27 = (undefined *)0x0;
      }
      xmlNanoHTTPSave(0,puVar27);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      if (iVar20 != iVar21) {
        iVar21 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoHTTPSave",(ulong)(uint)(iVar21 - iVar20));
        iVar19 = iVar19 + 1;
        printf(" %d",(ulong)uVar30);
        printf(" %d");
        putchar(10);
      }
      uVar24 = uVar24 + 1;
      ppuVar23 = ppuVar23 + 1;
    } while (uVar24 != 6);
    uVar30 = 1;
    uVar24 = 0;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  puVar29 = &DAT_00162d88;
  do {
    if (uVar24 < 7) {
      uVar28 = *puVar29;
    }
    else {
      uVar28 = 0;
    }
    xmlNanoHTTPScanProxy(uVar28);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar24 = uVar24 + 1;
    puVar29 = puVar29 + 1;
  } while (uVar24 != 8);
  function_tests = function_tests + 1;
  uVar30 = iVar16 + iVar17 +
           (uint)(iVar5 != iVar6) + (uint)(iVar3 != iVar4) + (uint)(iVar7 != iVar8) +
           (uint)(iVar9 != iVar10) + iVar11 + (uint)(iVar12 != iVar13) + local_40 + iVar14 +
           (uint)(iVar15 != iVar18) + iVar19;
  if (uVar30 != 0) {
    printf("Module nanohttp: %d errors\n",(ulong)uVar30);
  }
  return uVar30;
}

Assistant:

static int
test_nanohttp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanohttp : 13 of 17 functions ...\n");
    test_ret += test_xmlNanoHTTPAuthHeader();
    test_ret += test_xmlNanoHTTPCleanup();
    test_ret += test_xmlNanoHTTPContentLength();
    test_ret += test_xmlNanoHTTPEncoding();
    test_ret += test_xmlNanoHTTPFetch();
    test_ret += test_xmlNanoHTTPInit();
    test_ret += test_xmlNanoHTTPMimeType();
    test_ret += test_xmlNanoHTTPOpen();
    test_ret += test_xmlNanoHTTPOpenRedir();
    test_ret += test_xmlNanoHTTPRead();
    test_ret += test_xmlNanoHTTPRedir();
    test_ret += test_xmlNanoHTTPReturnCode();
    test_ret += test_xmlNanoHTTPSave();
    test_ret += test_xmlNanoHTTPScanProxy();

    if (test_ret != 0)
	printf("Module nanohttp: %d errors\n", test_ret);
    return(test_ret);
}